

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_shader_object_features
          (Impl *this,Value *state,VkPhysicalDeviceShaderObjectFeaturesEXT **out_features)

{
  uint uVar1;
  VkPhysicalDeviceShaderObjectFeaturesEXT *pVVar2;
  Type this_00;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceShaderObjectFeaturesEXT>
                     (&this->allocator);
  *out_features = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"shaderObject");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->shaderObject = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_shader_object_features(
		const Value &state,
		VkPhysicalDeviceShaderObjectFeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceShaderObjectFeaturesEXT>();
	*out_features = features;

	features->shaderObject = state["shaderObject"].GetUint();
	return true;
}